

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

LiteralString * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::u32string,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1,basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                  *args_2,TokenKind *args_3,char (*args_4) [1],char (*args_5) [1])

{
  LiteralString *block_indent;
  allocator<char> *in_RCX;
  UString *in_RDX;
  undefined8 in_RSI;
  list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *in_RDI;
  undefined4 *in_R8;
  LiteralString *in_R9;
  LiteralString *r;
  allocator<char> *__x;
  TokenKind token_kind;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 uVar1;
  string *in_stack_ffffffffffffff60;
  allocator<char> local_91;
  string local_90 [55];
  allocator<char> local_59;
  string local_58 [32];
  LiteralString *local_38;
  LiteralString *local_30;
  undefined4 *local_28;
  allocator<char> *local_20;
  UString *local_18;
  TokenKind TStack_c;
  
  TStack_c = (TokenKind)((ulong)in_RSI >> 0x20);
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  block_indent = (LiteralString *)operator_new(0xe8);
  uVar1 = *local_28;
  token_kind = TStack_c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (char *)CONCAT44(uVar1,in_stack_ffffffffffffff48),local_20);
  __x = &local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (char *)CONCAT44(uVar1,in_stack_ffffffffffffff48),local_20);
  LiteralString::LiteralString
            (local_30,(LocationRange *)CONCAT44(uVar1,in_stack_ffffffffffffff48),(Fodder *)local_20,
             local_18,token_kind,(string *)block_indent,in_stack_ffffffffffffff60);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  local_38 = block_indent;
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            (in_RDI,(value_type *)__x);
  return local_38;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }